

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetJacTimes(void *arkode_mem,ARKLsJacTimesSetupFn jtsetup,ARKLsJacTimesVecFn jtimes)

{
  ARKLsMem pAVar1;
  ARKLsMem in_RDX;
  ARKLsMem in_RSI;
  void *in_RDI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,(char *)in_RDX,(ARKodeMem *)in_stack_ffffffffffffffd8,
                             in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    if (*(long *)(*(long *)&in_stack_ffffffffffffffd0[7]->jacDQ + 0x10) == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-3,"ARKLS","arkLSSetJacTimes",
                      "SUNLinearSolver object does not support user-supplied ATimes routine");
      local_4 = -3;
    }
    else {
      if (in_RDX == (ARKLsMem)0x0) {
        *(undefined4 *)(in_stack_ffffffffffffffd0 + 0x1d) = 1;
        in_stack_ffffffffffffffd0[0x1e] = (ARKLsMem)0x0;
        in_stack_ffffffffffffffd0[0x1f] = (ARKLsMem)arkLsDQJtimes;
        in_stack_ffffffffffffffd0[0x21] = (ARKLsMem)in_stack_ffffffffffffffd8;
        pAVar1 = (ARKLsMem)(*in_stack_ffffffffffffffd8->step_getimplicitrhs)(in_RDI);
        in_stack_ffffffffffffffd0[0x20] = pAVar1;
        if (in_stack_ffffffffffffffd0[0x20] == (ARKLsMem)0x0) {
          arkProcessError(in_stack_ffffffffffffffd8,-3,"ARKLS","arkLSSetJacTimes",
                          "Time step module is missing implicit RHS fcn");
          return -3;
        }
      }
      else {
        *(undefined4 *)(in_stack_ffffffffffffffd0 + 0x1d) = 0;
        in_stack_ffffffffffffffd0[0x1e] = in_RSI;
        in_stack_ffffffffffffffd0[0x1f] = in_RDX;
        in_stack_ffffffffffffffd0[0x21] = (ARKLsMem)in_stack_ffffffffffffffd8->user_data;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkLSSetJacTimes(void *arkode_mem,
                     ARKLsJacTimesSetupFn jtsetup,
                     ARKLsJacTimesVecFn jtimes)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacTimes",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetJacTimes",
                    "SUNLinearSolver object does not support user-supplied ATimes routine");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL) {
    arkls_mem->jtimesDQ = SUNFALSE;
    arkls_mem->jtsetup  = jtsetup;
    arkls_mem->jtimes   = jtimes;
    arkls_mem->Jt_data  = ark_mem->user_data;
  } else {
    arkls_mem->jtimesDQ = SUNTRUE;
    arkls_mem->jtsetup  = NULL;
    arkls_mem->jtimes   = arkLsDQJtimes;
    arkls_mem->Jt_data  = ark_mem;
    arkls_mem->Jt_f     = ark_mem->step_getimplicitrhs(arkode_mem);

    if (arkls_mem->Jt_f == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetJacTimes",
                      "Time step module is missing implicit RHS fcn");
      return(ARKLS_ILL_INPUT);
    }
  }

  return(ARKLS_SUCCESS);
}